

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O3

void Qentem::Digit::powerOfNegativeTen<unsigned_long_long>
               (unsigned_long_long *number,SizeT32 exponent)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  unsigned_long_long *puVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 uStack_68;
  ulong local_60;
  unsigned_long_long local_58 [4];
  ulong *local_38;
  
  puVar7 = &uStack_68;
  uVar18 = 2;
  local_38 = number;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[0] = *number;
  local_60 = 0;
  do {
    uVar18 = (ulong)((int)uVar18 - 1);
  } while (local_58[uVar18 - 1] == 0);
  uStack_68._4_4_ = exponent + 0x40;
  if (0x1a < exponent) {
    do {
      iVar4 = -(int)uVar18;
      uVar2 = (ulong)((int)uVar18 + 1);
      uVar6 = uVar18;
      while( true ) {
        uVar1 = (int)uVar2 - 1;
        uVar3 = (ulong)uVar1;
        lVar9 = 4 - uVar2;
        if (4 < uVar2) {
          lVar9 = 0;
        }
        uVar11 = local_58[uVar3 - 1] & 0xffffffff;
        uVar8 = uVar11 * 0x91e07e48;
        uVar16 = local_58[uVar3 - 1] >> 0x20;
        uVar15 = (uVar8 >> 0x20) + uVar16 * 0x91e07e48;
        uVar11 = uVar11 * 0x9e74d1b7 + (uVar15 & 0xffffffff);
        lVar12 = (uVar11 >> 0x20) + (uVar15 >> 0x20) + uVar16 * 0x9e74d1b7;
        local_58[uVar3 - 1] = uVar11 << 0x20 | uVar8 & 0xffffffff;
        uVar8 = uVar6;
        if (lVar12 != 0) {
          lVar14 = 0;
          do {
            if (lVar9 == lVar14) {
              uVar8 = 0;
              uVar18 = 0;
              if (uVar1 == 0) goto LAB_00114c63;
              goto LAB_00114c21;
            }
            uVar8 = local_58[uVar2 + lVar14 + -1];
            uVar11 = lVar12 + uVar8;
            local_58[uVar2 + lVar14 + -1] = uVar11;
            lVar14 = lVar14 + 1;
            lVar12 = 1;
          } while (uVar11 <= uVar8);
          uVar13 = (int)lVar14 - iVar4;
          if ((uint)uVar6 < uVar13) {
            uVar18 = (ulong)uVar13;
          }
          uVar8 = (ulong)uVar13;
          if (uVar13 < (uint)uVar6) {
            uVar8 = uVar6;
          }
        }
        if (uVar1 == 0) break;
LAB_00114c21:
        iVar4 = iVar4 + 1;
        uVar2 = uVar3;
        uVar6 = uVar8;
      }
      iVar4 = (int)uVar18;
      if (iVar4 == 0) {
LAB_00114c63:
        uVar18 = 0;
        local_60 = 0;
      }
      else {
        uVar1 = iVar4 + 1;
        if (uVar1 < 3) {
          uVar1 = 2;
        }
        memmove(&local_60,local_58,(ulong)(uVar1 - 1) << 3);
        local_58[uVar18 - 1] = 0;
        uVar18 = (ulong)(iVar4 - 1);
      }
      uStack_68._4_4_ = uStack_68._4_4_ + 0x3e;
      exponent = exponent - 0x1b;
    } while (0x1a < exponent);
  }
  if (exponent != 0) {
    iVar4 = -(int)uVar18;
    uVar8 = *(ulong *)(DigitUtils::DigitConst<8u>::GetPowerOfOneOverFive(unsigned_int)::
                       PowerOfOneOverFive + (ulong)exponent * 8) & 0xffffffff;
    uVar3 = *(ulong *)(DigitUtils::DigitConst<8u>::GetPowerOfOneOverFive(unsigned_int)::
                       PowerOfOneOverFive + (ulong)exponent * 8) >> 0x20;
    uVar2 = (ulong)((int)uVar18 + 1);
    uVar6 = uVar18;
    while( true ) {
      uVar1 = (int)uVar2 - 1;
      uVar11 = (ulong)uVar1;
      lVar9 = 4 - uVar2;
      if (4 < uVar2) {
        lVar9 = 0;
      }
      uVar15 = local_58[uVar11 - 1] & 0xffffffff;
      uVar19 = uVar15 * uVar8;
      uVar16 = local_58[uVar11 - 1] >> 0x20;
      uVar20 = (uVar19 >> 0x20) + uVar16 * uVar8;
      uVar15 = uVar15 * uVar3 + (uVar20 & 0xffffffff);
      lVar12 = (uVar15 >> 0x20) + (uVar20 >> 0x20) + uVar16 * uVar3;
      local_58[uVar11 - 1] = uVar15 << 0x20 | uVar19 & 0xffffffff;
      uVar15 = uVar6;
      if (lVar12 != 0) {
        lVar14 = 0;
        do {
          if (lVar9 == lVar14) {
            uVar15 = 0;
            uVar18 = 0;
            if (uVar1 == 0) goto LAB_00114da3;
            goto LAB_00114d5a;
          }
          uVar15 = local_58[uVar2 + lVar14 + -1];
          uVar16 = lVar12 + uVar15;
          local_58[uVar2 + lVar14 + -1] = uVar16;
          lVar14 = lVar14 + 1;
          lVar12 = 1;
        } while (uVar16 <= uVar15);
        uVar13 = (int)lVar14 - iVar4;
        if ((uint)uVar6 < uVar13) {
          uVar18 = (ulong)uVar13;
        }
        uVar15 = (ulong)uVar13;
        if (uVar13 < (uint)uVar6) {
          uVar15 = uVar6;
        }
      }
      if (uVar1 == 0) break;
LAB_00114d5a:
      iVar4 = iVar4 + 1;
      uVar2 = uVar11;
      uVar6 = uVar15;
    }
    iVar4 = (int)uVar18;
    if (iVar4 == 0) {
LAB_00114da3:
      uVar18 = 0;
      local_60 = 0;
    }
    else {
      uVar1 = 2;
      if (2 < iVar4 + 1U) {
        uVar1 = iVar4 + 1U;
      }
      memmove(&local_60,local_58,(ulong)(uVar1 - 1) << 3);
      local_58[uVar18 - 1] = 0;
      uVar18 = (ulong)(iVar4 - 1);
    }
    uStack_68._4_4_ =
         uStack_68._4_4_ +
         *(int *)(DigitUtils::DigitConst<8u>::GetPowerOfOneOverFiveShift(unsigned_int)::
                  PowerOfOneOverFiveShift + (ulong)exponent * 4);
  }
  uVar17 = (uint)uVar18;
  uVar13 = (uVar17 << 6 | (uint)LZCOUNT(local_58[uVar18 - 1])) ^ 0x3f;
  uVar1 = uVar13 - 0x35;
  if (0x3f < uVar1) {
    uVar5 = uVar1 >> 6;
    if (uVar17 < uVar5) {
      local_60 = 0;
      goto LAB_00114e74;
    }
    uVar1 = uVar1 & 0x3f;
    uVar10 = uVar5;
    do {
      puVar7 = puVar7 + 1;
      uVar2 = (ulong)uVar10;
      uVar10 = uVar10 + 1;
      *puVar7 = local_58[uVar2 - 1];
    } while (uVar10 <= uVar17);
    do {
      uVar17 = (int)uVar18 - 1;
      uVar5 = uVar5 - 1;
      local_58[uVar18 - 1] = 0;
      uVar18 = (ulong)uVar17;
    } while (uVar5 != 0);
  }
  if (uVar1 != 0) {
    local_60 = local_60 >> ((ulong)uVar1 & 0x3f);
    if (uVar17 != 0) {
      uVar18 = local_60;
      uVar2 = 0;
      do {
        uVar3 = local_58[uVar2] << ((ulong)(0x40 - uVar1) & 0x3f) | uVar18;
        uVar18 = local_58[uVar2] >> ((ulong)uVar1 & 0x3f);
        uVar6 = uVar2 + 1;
        local_58[uVar2 - 1] = uVar3;
        local_58[uVar2] = uVar18;
        uVar2 = uVar6;
      } while (uVar17 != uVar6);
    }
  }
LAB_00114e74:
  uVar1 = uStack_68._4_4_ - uVar13;
  if (uStack_68._4_4_ < uVar13 || uVar1 == 0) {
    local_60 = ((uint)local_60 & 1) + local_60;
    uVar18 = (ulong)(((uVar13 - uStack_68._4_4_) - (uint)(local_60 >> 0x36 == 0)) + 0x400);
  }
  else if (uVar1 < 0x3ff) {
    local_60 = ((uint)local_60 & 1) + local_60;
    uVar18 = (ulong)(0x3ff - ((uVar1 - 1) + (uint)(local_60 >> 0x36 == 0)));
  }
  else {
    local_60 = (local_60 >> ((ulong)(uVar1 - 0x3fe) & 0x3f)) +
               (ulong)((local_60 >> ((ulong)(uVar1 - 0x3fe) & 0x3f) & 1) != 0);
    uVar18 = (ulong)(local_60 >> 0x35 != 0);
  }
  *local_38 = uVar18 << 0x34 | local_60 >> 1 & 0xfffffffffffff;
  return;
}

Assistant:

static void powerOfNegativeTen(Number_T &number, SizeT32 exponent) noexcept {
        using UNumber_T  = SizeT64;
        using DigitConst = DigitUtils::DigitConst<sizeof(UNumber_T)>;
        //////////////////////////////////////////////////////////////
        BigInt<UNumber_T, 256U> b_int{number};
        //////////////////////////////////////////////////////////////
        SizeT32 shifted{exponent};
        //////////////////////////////////////////////////////////////
        shifted += 64U;
        b_int <<= 64U;
        //////////////////////////////////////////////////////////////
        constexpr bool is_size_8 = (sizeof(UNumber_T) == 8U);
        if QENTEM_CONST_EXPRESSION (is_size_8) {
            while (exponent >= DigitConst::MaxPowerOfFive) {
                // 2**126 = 85070591730234615865843651857942052864
                // 5**27 = 7450580596923828125 (MaxPowerOfFive)
                // 2**126 / 5**27 = 11417981541647679048.4
                // 126-64=62; See 2**126 and 64 shift

                b_int *= DigitConst::GetPowerOfOneOverFive(DigitConst::MaxPowerOfFive);
                b_int >>= DigitConst::MaxShift;
                shifted += DigitConst::GetPowerOfOneOverFiveShift(DigitConst::MaxPowerOfFive);
                exponent -= DigitConst::MaxPowerOfFive;
            }

            if (exponent != 0) {
                b_int *= DigitConst::GetPowerOfOneOverFive(exponent);
                b_int >>= DigitConst::MaxShift;
                shifted += DigitConst::GetPowerOfOneOverFiveShift(exponent);
            }
        } else {
            while (exponent >= DigitConst::MaxPowerOfFive) {
                b_int <<= DigitConst::MaxShift;
                b_int /= DigitConst::GetPowerOfFive(DigitConst::MaxPowerOfFive);
                shifted += DigitConst::MaxShift;
                exponent -= DigitConst::MaxPowerOfFive;
            }

            if (exponent != 0) {
                b_int <<= DigitConst::MaxShift;
                b_int /= DigitConst::GetPowerOfFive(exponent);
                shifted += DigitConst::MaxShift;
            }
        }
        //////////////////////////////////////////////////////////////
        SizeT32       exp = DigitUtils::RealNumberInfo<double, 8U>::Bias; // double only
        const SizeT32 bit = b_int.FindLastBit();

        // if (bit <= 52U) {
        //     number = SizeT64(b_int);
        //     number <<= (53U - bit);
        // } else {
        b_int >>= (bit - SizeT32{53});
        number = SizeT64(b_int);
        // }
        //////////////////////////////////////////////////////////////
        if (shifted <= bit) {
            shifted = (bit - shifted);
            exp += shifted;

            number += (number & Number_T{1});
            number >>= 1U;
            exp += (number > Number_T{0x1FFFFFFFFFFFFF});
        } else {
            shifted -= bit;

            if (exp > shifted) {
                exp -= shifted;
                number += (number & Number_T{1});
                number >>= 1U;
                exp += (number > Number_T{0x1FFFFFFFFFFFFF});
            } else {
                shifted -= exp;
                ++shifted;
                number >>= shifted;
                number += (number & Number_T{1});
                number >>= 1U;
                exp = (number > Number_T{0xFFFFFFFFFFFFF});
            }
        }

        number &= 0xFFFFFFFFFFFFFULL;
        number |= (SizeT64(exp) << 52U);
    }